

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectAppearance.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::ObjectAppearance::ObjectAppearance
          (ObjectAppearance *this,KUINT8 PerCent,ObjectDamage OD,KBOOL Predist,KBOOL State,
          KBOOL Smoking,KBOOL Flaming)

{
  KException *this_00;
  KString local_50;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__ObjectAppearance_00224c70;
  if (PerCent < 0x65) {
    (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
         (ushort)Flaming << 0xd |
         (ushort)Smoking << 0xc | (ushort)State << 0xb |
         (ushort)Predist << 10 | (ushort)PerCent |
         (ushort)((OD & (ObjectDestroyed|ObjectDamaged)) << 8) |
         (ushort)*(undefined4 *)&this->m_GeneralAppearanceUnion & 0xc000;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ObjectAppearance","");
  KException::KException<char_const*>(this_00,&local_50,8,"PerCent Acceptable values are 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

ObjectAppearance::ObjectAppearance(KUINT8 PerCent, ObjectDamage OD, KBOOL Predist, KBOOL State,
                                   KBOOL Smoking, KBOOL Flaming) noexcept(false)
{
    if( PerCent > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "PerCent Acceptable values are 0-100." );

    m_GeneralAppearanceUnion.m_ui16PcComp = PerCent;
    m_GeneralAppearanceUnion.m_ui16Dmg = OD;
    m_GeneralAppearanceUnion.m_ui16Predistributed = Predist;
    m_GeneralAppearanceUnion.m_ui16State = State;
    m_GeneralAppearanceUnion.m_ui16Smoking = Smoking;
    m_GeneralAppearanceUnion.m_ui16Flaming = Flaming;
}